

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O0

Abc_Ntk_t *
Abc_NtkStartFromWithLatches(Abc_Ntk_t *pNtk,Abc_NtkType_t Type,Abc_NtkFunc_t Func,int nLatches)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  Abc_Obj_t *pAVar7;
  Vec_Vec_t *pVVar8;
  Abc_Cex_t *pAVar9;
  Vec_Int_t *pVVar10;
  float fVar11;
  int local_50;
  int i;
  int fCopyNames;
  Abc_Obj_t *pNode1;
  Abc_Obj_t *pNode0;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkNew;
  int nLatches_local;
  Abc_NtkFunc_t Func_local;
  Abc_NtkType_t Type_local;
  Abc_Ntk_t *pNtk_local;
  
  if (pNtk == (Abc_Ntk_t *)0x0) {
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    iVar1 = Abc_NtkLatchNum(pNtk);
    if (iVar1 != 0) {
      __assert_fail("Abc_NtkLatchNum(pNtk) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNtk.c"
                    ,0xb9,
                    "Abc_Ntk_t *Abc_NtkStartFromWithLatches(Abc_Ntk_t *, Abc_NtkType_t, Abc_NtkFunc_t, int)"
                   );
    }
    pNtk_local = Abc_NtkAlloc(Type,Func,1);
    pNtk_local->nConstrs = pNtk->nConstrs;
    pNtk_local->nBarBufs = pNtk->nBarBufs;
    pcVar3 = Extra_UtilStrsav(pNtk->pName);
    pNtk_local->pName = pcVar3;
    pcVar3 = Extra_UtilStrsav(pNtk->pSpec);
    pNtk_local->pSpec = pcVar3;
    Abc_NtkCleanCopy(pNtk);
    iVar1 = Abc_NtkIsStrash(pNtk);
    if ((iVar1 != 0) && (iVar1 = Abc_NtkIsStrash(pNtk_local), iVar1 != 0)) {
      pAVar4 = Abc_AigConst1(pNtk_local);
      pAVar5 = Abc_AigConst1(pNtk);
      (pAVar5->field_6).pCopy = pAVar4;
    }
    for (local_50 = 0; iVar1 = Abc_NtkPiNum(pNtk), local_50 < iVar1 - nLatches;
        local_50 = local_50 + 1) {
      pAVar4 = Abc_NtkPi(pNtk,local_50);
      Abc_NtkDupObj(pNtk_local,pAVar4,(uint)(Type != ABC_NTK_NETLIST));
    }
    for (local_50 = 0; iVar1 = Abc_NtkPoNum(pNtk), local_50 < iVar1 - nLatches;
        local_50 = local_50 + 1) {
      pAVar4 = Abc_NtkPo(pNtk,local_50);
      Abc_NtkDupObj(pNtk_local,pAVar4,(uint)(Type != ABC_NTK_NETLIST));
    }
    for (local_50 = 0; local_50 < nLatches; local_50 = local_50 + 1) {
      pAVar4 = Abc_NtkCreateLatch(pNtk_local);
      Abc_LatchSetInit0(pAVar4);
      pAVar5 = Abc_NtkCreateBi(pNtk_local);
      iVar1 = Abc_NtkPoNum(pNtk);
      pAVar6 = Abc_NtkPo(pNtk,(iVar1 - nLatches) + local_50);
      (pAVar6->field_6).pCopy = pAVar5;
      pAVar6 = Abc_NtkCreateBo(pNtk_local);
      iVar1 = Abc_NtkPiNum(pNtk);
      pAVar7 = Abc_NtkPi(pNtk,(iVar1 - nLatches) + local_50);
      (pAVar7->field_6).pCopy = pAVar6;
      Abc_ObjAddFanin(pAVar4,pAVar5);
      Abc_ObjAddFanin(pAVar6,pAVar4);
      pcVar3 = Abc_ObjName(pAVar5);
      Abc_ObjAssignName(pAVar5,pcVar3,(char *)0x0);
      pcVar3 = Abc_ObjName(pAVar6);
      Abc_ObjAssignName(pAVar6,pcVar3,(char *)0x0);
    }
    Abc_ManTimeDup(pNtk,pNtk_local);
    if (pNtk->vOnehots != (Vec_Ptr_t *)0x0) {
      pVVar8 = Vec_VecDupInt((Vec_Vec_t *)pNtk->vOnehots);
      pNtk_local->vOnehots = (Vec_Ptr_t *)pVVar8;
    }
    if (pNtk->pSeqModel != (Abc_Cex_t *)0x0) {
      pAVar9 = pNtk->pSeqModel;
      iVar1 = Abc_NtkLatchNum(pNtk);
      pAVar9 = Abc_CexDup(pAVar9,iVar1);
      pNtk_local->pSeqModel = pAVar9;
    }
    if (pNtk->vObjPerm != (Vec_Int_t *)0x0) {
      pVVar10 = Vec_IntDup(pNtk->vObjPerm);
      pNtk_local->vObjPerm = pVVar10;
    }
    pNtk_local->AndGateDelay = pNtk->AndGateDelay;
    if ((((pNtk->AndGateDelay != 0.0) || (NAN(pNtk->AndGateDelay))) &&
        (pNtk->pManTime != (Abc_ManTime_t *)0x0)) &&
       ((pNtk->ntkType != ABC_NTK_STRASH && (Type == ABC_NTK_STRASH)))) {
      for (local_50 = 0; iVar1 = Abc_NtkCiNum(pNtk), local_50 < iVar1; local_50 = local_50 + 1) {
        pAVar4 = Abc_NtkCi(pNtk,local_50);
        fVar11 = Abc_NodeReadArrivalWorst(pAVar4);
        fVar11 = Abc_MaxFloat(0.0,fVar11);
        *(uint *)((long)(pAVar4->field_6).pTemp + 0x14) =
             *(uint *)((long)(pAVar4->field_6).pTemp + 0x14) & 0xfff |
             (int)(fVar11 / pNtk->AndGateDelay) << 0xc;
      }
    }
    iVar1 = Abc_NtkCiNum(pNtk);
    iVar2 = Abc_NtkCiNum(pNtk_local);
    if (iVar1 != iVar2) {
      __assert_fail("Abc_NtkCiNum(pNtk) == Abc_NtkCiNum(pNtkNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNtk.c"
                    ,0xee,
                    "Abc_Ntk_t *Abc_NtkStartFromWithLatches(Abc_Ntk_t *, Abc_NtkType_t, Abc_NtkFunc_t, int)"
                   );
    }
    iVar1 = Abc_NtkCoNum(pNtk);
    iVar2 = Abc_NtkCoNum(pNtk_local);
    if (iVar1 != iVar2) {
      __assert_fail("Abc_NtkCoNum(pNtk) == Abc_NtkCoNum(pNtkNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNtk.c"
                    ,0xef,
                    "Abc_Ntk_t *Abc_NtkStartFromWithLatches(Abc_Ntk_t *, Abc_NtkType_t, Abc_NtkFunc_t, int)"
                   );
    }
    iVar1 = Abc_NtkLatchNum(pNtk_local);
    if (nLatches != iVar1) {
      __assert_fail("nLatches == Abc_NtkLatchNum(pNtkNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNtk.c"
                    ,0xf0,
                    "Abc_Ntk_t *Abc_NtkStartFromWithLatches(Abc_Ntk_t *, Abc_NtkType_t, Abc_NtkFunc_t, int)"
                   );
    }
  }
  return pNtk_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkStartFromWithLatches( Abc_Ntk_t * pNtk, Abc_NtkType_t Type, Abc_NtkFunc_t Func, int nLatches )
{
    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pObj, * pNode0, * pNode1;
    int fCopyNames, i;
    if ( pNtk == NULL )
        return NULL;
    assert( Abc_NtkLatchNum(pNtk) == 0 );
    // decide whether to copy the names
    fCopyNames = ( Type != ABC_NTK_NETLIST );
    // start the network
    pNtkNew = Abc_NtkAlloc( Type, Func, 1 );
    pNtkNew->nConstrs   = pNtk->nConstrs;
    pNtkNew->nBarBufs   = pNtk->nBarBufs;
    // duplicate the name and the spec
    pNtkNew->pName = Extra_UtilStrsav(pNtk->pName);
    pNtkNew->pSpec = Extra_UtilStrsav(pNtk->pSpec);
    // clean the node copy fields
    Abc_NtkCleanCopy( pNtk );
    // map the constant nodes
    if ( Abc_NtkIsStrash(pNtk) && Abc_NtkIsStrash(pNtkNew) )
        Abc_AigConst1(pNtk)->pCopy = Abc_AigConst1(pNtkNew);
    // clone CIs/CIs/boxes
    for ( i = 0; i < Abc_NtkPiNum(pNtk)-nLatches; i++ )
        Abc_NtkDupObj( pNtkNew, Abc_NtkPi(pNtk, i), fCopyNames );
    for ( i = 0; i < Abc_NtkPoNum(pNtk)-nLatches; i++ )
        Abc_NtkDupObj( pNtkNew, Abc_NtkPo(pNtk, i), fCopyNames );
    for ( i = 0; i < nLatches; i++ )
    {
        pObj = Abc_NtkCreateLatch(pNtkNew);
        Abc_LatchSetInit0( pObj );
        pNode0 = Abc_NtkCreateBi(pNtkNew);
        Abc_NtkPo(pNtk, Abc_NtkPoNum(pNtk)-nLatches+i)->pCopy = pNode0;
        pNode1 = Abc_NtkCreateBo(pNtkNew);
        Abc_NtkPi(pNtk, Abc_NtkPiNum(pNtk)-nLatches+i)->pCopy = pNode1;
        Abc_ObjAddFanin( pObj, pNode0 );
        Abc_ObjAddFanin( pNode1, pObj );
        Abc_ObjAssignName( pNode0, Abc_ObjName(pNode0), NULL );
        Abc_ObjAssignName( pNode1, Abc_ObjName(pNode1), NULL );
    }
    // transfer logic level
//    Abc_NtkForEachCi( pNtk, pObj, i )
//        pObj->pCopy->Level = pObj->Level;
    // transfer the names
//    Abc_NtkTrasferNames( pNtk, pNtkNew );
    Abc_ManTimeDup( pNtk, pNtkNew );
    if ( pNtk->vOnehots )
        pNtkNew->vOnehots = (Vec_Ptr_t *)Vec_VecDupInt( (Vec_Vec_t *)pNtk->vOnehots );
    if ( pNtk->pSeqModel )
        pNtkNew->pSeqModel = Abc_CexDup( pNtk->pSeqModel, Abc_NtkLatchNum(pNtk) );
    if ( pNtk->vObjPerm )
        pNtkNew->vObjPerm = Vec_IntDup( pNtk->vObjPerm );
    pNtkNew->AndGateDelay = pNtk->AndGateDelay;
    // initialize logic level of the CIs
    if ( pNtk->AndGateDelay != 0.0 && pNtk->pManTime != NULL && pNtk->ntkType != ABC_NTK_STRASH && Type == ABC_NTK_STRASH )
    {
        Abc_NtkForEachCi( pNtk, pObj, i )
            pObj->pCopy->Level = (int)(Abc_MaxFloat(0, Abc_NodeReadArrivalWorst(pObj)) / pNtk->AndGateDelay);
    }
    // check that the CI/CO/latches are copied correctly
    assert( Abc_NtkCiNum(pNtk)    == Abc_NtkCiNum(pNtkNew) );
    assert( Abc_NtkCoNum(pNtk)    == Abc_NtkCoNum(pNtkNew) );
    assert( nLatches              == Abc_NtkLatchNum(pNtkNew) );
    return pNtkNew;
}